

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostip.c
# Opt level: O0

Curl_dns_entry * Curl_fetch_addr(connectdata *conn,char *hostname,int port)

{
  SessionHandle *data_00;
  Curl_dns_entry *pCVar1;
  Curl_dns_entry *dns;
  SessionHandle *data;
  int port_local;
  char *hostname_local;
  connectdata *conn_local;
  
  data_00 = conn->data;
  if (data_00->share != (Curl_share *)0x0) {
    Curl_share_lock(data_00,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
  }
  pCVar1 = fetch_addr(conn,hostname,port);
  if (pCVar1 != (Curl_dns_entry *)0x0) {
    pCVar1->inuse = pCVar1->inuse + 1;
  }
  if (data_00->share != (Curl_share *)0x0) {
    Curl_share_unlock(data_00,CURL_LOCK_DATA_DNS);
  }
  return pCVar1;
}

Assistant:

struct Curl_dns_entry *
Curl_fetch_addr(struct connectdata *conn,
                const char *hostname,
                int port)
{
  struct SessionHandle *data = conn->data;
  struct Curl_dns_entry *dns = NULL;

  if(data->share)
    Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

  dns = fetch_addr(conn, hostname, port);

  if(dns) dns->inuse++; /* we use it! */

  if(data->share)
    Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

  return dns;
}